

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

REJECTED_HANDLE rejected_create(void)

{
  AMQP_VALUE pAVar1;
  REJECTED_HANDLE local_10;
  REJECTED_INSTANCE *rejected_instance;
  
  local_10 = (REJECTED_HANDLE)malloc(8);
  if (local_10 != (REJECTED_HANDLE)0x0) {
    pAVar1 = amqpvalue_create_composite_with_ulong_descriptor(0x25);
    local_10->composite_value = pAVar1;
    if (local_10->composite_value == (AMQP_VALUE)0x0) {
      free(local_10);
      local_10 = (REJECTED_HANDLE)0x0;
    }
  }
  return local_10;
}

Assistant:

REJECTED_HANDLE rejected_create(void)
{
    REJECTED_INSTANCE* rejected_instance = (REJECTED_INSTANCE*)malloc(sizeof(REJECTED_INSTANCE));
    if (rejected_instance != NULL)
    {
        rejected_instance->composite_value = amqpvalue_create_composite_with_ulong_descriptor(37);
        if (rejected_instance->composite_value == NULL)
        {
            free(rejected_instance);
            rejected_instance = NULL;
        }
    }

    return rejected_instance;
}